

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.cpp
# Opt level: O0

void __thiscall Simulation::initSimulationRendering(Simulation *this)

{
  allocator<float> *paVar1;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  undefined4 local_6bc;
  undefined4 local_6b8;
  undefined4 local_6b4;
  vec<3,_float,_(glm::qualifier)0> local_6b0;
  vec<3,_float,_(glm::qualifier)0> local_6a4 [6];
  vec<3,float,(glm::qualifier)0> local_658 [12];
  vec<3,float,(glm::qualifier)0> avStack_64c [12];
  vec<3,float,(glm::qualifier)0> avStack_640 [12];
  undefined4 local_634;
  undefined4 local_630;
  undefined4 local_62c;
  vec<3,_float,_(glm::qualifier)0> local_628;
  vec<3,_float,_(glm::qualifier)0> local_61c [6];
  vec<3,float,(glm::qualifier)0> local_5d0 [12];
  vec<3,float,(glm::qualifier)0> avStack_5c4 [12];
  vec<3,float,(glm::qualifier)0> avStack_5b8 [14];
  undefined1 local_5aa;
  allocator<float> local_5a9;
  float local_5a8 [8];
  iterator local_588;
  size_type local_580;
  undefined1 local_578 [8];
  Material materialGridBorder;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  undefined1 auStack_4a8 [8];
  Shader shaderProgramGridBorder;
  float local_458 [8];
  iterator local_438;
  size_type local_430;
  undefined1 local_428 [8];
  Material materialGrid;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  undefined1 auStack_358 [8];
  Shader shaderProgramGrid;
  float local_308 [8];
  iterator local_2e8;
  size_type local_2e0;
  undefined1 local_2d8 [8];
  Material materialVec;
  string local_250;
  allocator<char> local_229;
  string local_228;
  undefined1 auStack_208 [8];
  Shader shaderProgramVec;
  float local_1b8 [8];
  iterator local_198;
  size_type local_190;
  undefined1 local_188 [8];
  Material material;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  Shader shaderProgram;
  Simulation *this_local;
  
  shaderProgram._fragPath.field_2._8_8_ = this;
  memset(local_58,0,0x48);
  Shader::Shader((Shader *)local_58);
  (this->_fluidRenderer).mesh.dim = Config::dim;
  if (Config::dim == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"shaders/vert.vert",&local_79);
    Shader::setVert((Shader *)local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"shaders/fluid3D.frag",&local_b1);
    Shader::setFrag((Shader *)local_58,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
  }
  else if (Config::dim == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"shaders/vert2D.vert",&local_d9);
    Shader::setVert((Shader *)local_58,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"shaders/fluid2D.frag",
               (allocator<char> *)
               ((long)&material.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    Shader::setFrag((Shader *)local_58,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&material.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
  }
  Shader::Shader((Shader *)local_188,(Shader *)local_58);
  shaderProgramVec._fragPath.field_2._M_local_buf[0xe] = '\x01';
  material.shader._fragPath.field_2._8_2_ = Config::dim;
  material.shader._fragPath.field_2._M_local_buf[10] = '\x01';
  material.shader._fragPath.field_2._M_local_buf[0xb] = '\0';
  material.shader._fragPath.field_2._12_4_ = 0x42c80000;
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&material.dim,1.0,1.0,1.0);
  material.lightIntensity.field_1.y = 0.0;
  material.lightIntensity.field_2.z = 0.0;
  local_1b8[4] = 0.0;
  local_1b8[5] = 0.0;
  local_1b8[6] = 0.0;
  local_1b8[7] = 1.0;
  local_1b8[0] = 1.0;
  local_1b8[1] = 1.0;
  local_1b8[2] = 1.0;
  local_1b8[3] = 0.0;
  local_198 = local_1b8;
  local_190 = 8;
  paVar1 = (allocator<float> *)(shaderProgramVec._fragPath.field_2._M_local_buf + 0xf);
  std::allocator<float>::allocator(paVar1);
  __l_02._M_len = local_190;
  __l_02._M_array = local_198;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&material.TBO,__l_02,paVar1);
  shaderProgramVec._fragPath.field_2._M_local_buf[0xe] = '\0';
  std::allocator<float>::~allocator
            ((allocator<float> *)(shaderProgramVec._fragPath.field_2._M_local_buf + 0xf));
  Material::operator=(&(this->_fluidRenderer).material,(Material *)local_188);
  Renderer::initMaterial(&this->_renderer,(Material *)local_188);
  Renderer::initMesh(&this->_renderer,&(this->_fluidRenderer).mesh);
  shaderProgramVec._fragPath._M_dataplus._M_p = (pointer)0x0;
  shaderProgramVec._fragPath._M_string_length = 0;
  shaderProgramVec._vertPath.field_2._M_allocated_capacity = 0;
  shaderProgramVec._vertPath.field_2._8_8_ = 0;
  shaderProgramVec._vertPath._M_dataplus._M_p = (pointer)0x0;
  shaderProgramVec._vertPath._M_string_length = 0;
  auStack_208 = (undefined1  [8])0x0;
  shaderProgramVec._id = 0;
  shaderProgramVec._4_4_ = 0;
  shaderProgramVec._fragPath.field_2._M_allocated_capacity = 0;
  Shader::Shader((Shader *)auStack_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"shaders/vert.vert",&local_229);
  Shader::setVert((Shader *)auStack_208,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"shaders/vec.frag",
             (allocator<char> *)
             ((long)&materialVec.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  Shader::setFrag((Shader *)auStack_208,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&materialVec.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  Shader::Shader((Shader *)local_2d8,(Shader *)auStack_208);
  shaderProgramGrid._fragPath.field_2._M_local_buf[0xe] = '\x01';
  materialVec.shader._fragPath.field_2._8_2_ = 2;
  materialVec.shader._fragPath.field_2._M_local_buf[10] = '\0';
  materialVec.shader._fragPath.field_2._M_local_buf[0xb] = '\0';
  materialVec.shader._fragPath.field_2._12_4_ = 0x42c80000;
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&materialVec.dim,1.0,1.0,1.0);
  materialVec.lightIntensity.field_1.y = 0.0;
  materialVec.lightIntensity.field_2.z = 0.0;
  local_308[4] = 0.0;
  local_308[5] = 0.0;
  local_308[6] = 0.0;
  local_308[7] = 1.0;
  local_308[0] = 1.0;
  local_308[1] = 1.0;
  local_308[2] = 1.0;
  local_308[3] = 0.0;
  local_2e8 = local_308;
  local_2e0 = 8;
  paVar1 = (allocator<float> *)(shaderProgramGrid._fragPath.field_2._M_local_buf + 0xf);
  std::allocator<float>::allocator(paVar1);
  __l_01._M_len = local_2e0;
  __l_01._M_array = local_2e8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&materialVec.TBO,__l_01,paVar1);
  shaderProgramGrid._fragPath.field_2._M_local_buf[0xe] = '\0';
  std::allocator<float>::~allocator
            ((allocator<float> *)(shaderProgramGrid._fragPath.field_2._M_local_buf + 0xf));
  Material::operator=(&(this->_fluidRenderer).materialVec,(Material *)local_2d8);
  Renderer::initMaterial(&this->_renderer,(Material *)local_2d8);
  shaderProgramGrid._fragPath._M_dataplus._M_p = (pointer)0x0;
  shaderProgramGrid._fragPath._M_string_length = 0;
  shaderProgramGrid._vertPath.field_2._M_allocated_capacity = 0;
  shaderProgramGrid._vertPath.field_2._8_8_ = 0;
  shaderProgramGrid._vertPath._M_dataplus._M_p = (pointer)0x0;
  shaderProgramGrid._vertPath._M_string_length = 0;
  auStack_358 = (undefined1  [8])0x0;
  shaderProgramGrid._id = 0;
  shaderProgramGrid._4_4_ = 0;
  shaderProgramGrid._fragPath.field_2._M_allocated_capacity = 0;
  Shader::Shader((Shader *)auStack_358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"shaders/vert.vert",&local_379);
  Shader::setVert((Shader *)auStack_358,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"shaders/grid.frag",
             (allocator<char> *)
             ((long)&materialGrid.texCoords.super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Shader::setFrag((Shader *)auStack_358,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&materialGrid.texCoords.super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Shader::Shader((Shader *)local_428,(Shader *)auStack_358);
  shaderProgramGridBorder._fragPath.field_2._M_local_buf[0xe] = '\x01';
  materialGrid.shader._fragPath.field_2._8_2_ = 2;
  materialGrid.shader._fragPath.field_2._M_local_buf[10] = '\0';
  materialGrid.shader._fragPath.field_2._M_local_buf[0xb] = '\0';
  materialGrid.shader._fragPath.field_2._12_4_ = 0x42c80000;
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&materialGrid.dim,1.0,1.0,1.0);
  materialGrid.lightIntensity.field_1.y = 0.0;
  materialGrid.lightIntensity.field_2.z = 0.0;
  local_458[4] = 0.0;
  local_458[5] = 0.0;
  local_458[6] = 0.0;
  local_458[7] = 1.0;
  local_458[0] = 1.0;
  local_458[1] = 1.0;
  local_458[2] = 1.0;
  local_458[3] = 0.0;
  local_438 = local_458;
  local_430 = 8;
  paVar1 = (allocator<float> *)(shaderProgramGridBorder._fragPath.field_2._M_local_buf + 0xf);
  std::allocator<float>::allocator(paVar1);
  __l_00._M_len = local_430;
  __l_00._M_array = local_438;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&materialGrid.TBO,__l_00,paVar1);
  shaderProgramGridBorder._fragPath.field_2._M_local_buf[0xe] = '\0';
  std::allocator<float>::~allocator
            ((allocator<float> *)(shaderProgramGridBorder._fragPath.field_2._M_local_buf + 0xf));
  Material::operator=(&(this->_fluidRenderer).materialGrid,(Material *)local_428);
  Renderer::initMaterial(&this->_renderer,(Material *)local_428);
  shaderProgramGridBorder._fragPath._M_dataplus._M_p = (pointer)0x0;
  shaderProgramGridBorder._fragPath._M_string_length = 0;
  shaderProgramGridBorder._vertPath.field_2._M_allocated_capacity = 0;
  shaderProgramGridBorder._vertPath.field_2._8_8_ = 0;
  shaderProgramGridBorder._vertPath._M_dataplus._M_p = (pointer)0x0;
  shaderProgramGridBorder._vertPath._M_string_length = 0;
  auStack_4a8 = (undefined1  [8])0x0;
  shaderProgramGridBorder._id = 0;
  shaderProgramGridBorder._4_4_ = 0;
  shaderProgramGridBorder._fragPath.field_2._M_allocated_capacity = 0;
  Shader::Shader((Shader *)auStack_4a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"shaders/vert.vert",&local_4c9);
  Shader::setVert((Shader *)auStack_4a8,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"shaders/gridBorder.frag",
             (allocator<char> *)
             ((long)&materialGridBorder.texCoords.super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Shader::setFrag((Shader *)auStack_4a8,&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&materialGridBorder.texCoords.super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Shader::Shader((Shader *)local_578,(Shader *)auStack_4a8);
  local_5aa = 1;
  materialGridBorder.shader._fragPath.field_2._8_2_ = 2;
  materialGridBorder.shader._fragPath.field_2._M_local_buf[10] = '\0';
  materialGridBorder.shader._fragPath.field_2._M_local_buf[0xb] = '\0';
  materialGridBorder.shader._fragPath.field_2._12_4_ = 0x42c80000;
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&materialGridBorder.dim,1.0,1.0,1.0);
  materialGridBorder.lightIntensity.field_1.y = 0.0;
  materialGridBorder.lightIntensity.field_2.z = 0.0;
  local_5a8[4] = 0.0;
  local_5a8[5] = 0.0;
  local_5a8[6] = 0.0;
  local_5a8[7] = 1.0;
  local_5a8[0] = 1.0;
  local_5a8[1] = 1.0;
  local_5a8[2] = 1.0;
  local_5a8[3] = 0.0;
  local_588 = local_5a8;
  local_580 = 8;
  std::allocator<float>::allocator(&local_5a9);
  __l._M_len = local_580;
  __l._M_array = local_588;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&materialGridBorder.TBO,__l,&local_5a9);
  local_5aa = 0;
  std::allocator<float>::~allocator(&local_5a9);
  Material::operator=(&(this->_fluidRenderer).materialGridBorder,(Material *)local_578);
  Renderer::initMaterial(&this->_renderer,(Material *)local_578);
  if (Config::dim == 3) {
    local_634 = 0xc40f0000;
    local_630 = 0xc1f80000;
    local_62c = 0x3f800000;
    glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_628,0.0,0.0,1.0);
    glm::vec<3,_float,_(glm::qualifier)0>::vec(local_61c,0.0,1.0,0.0);
    glm::zero<glm::mat<4,4,float,(glm::qualifier)0>>();
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>(local_5d0,14.85,9.39,-8.22);
    glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>(avStack_5c4,0x5a,0,0);
    glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>(avStack_5b8,1,1,1);
    memcpy(&this->_camera,&local_634,0x88);
  }
  else if (Config::dim == 2) {
    local_6bc = 0xc3870000;
    local_6b8 = 0xc2b40000;
    local_6b4 = 0x3f800000;
    glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_6b0,0.0,0.0,1.0);
    glm::vec<3,_float,_(glm::qualifier)0>::vec(local_6a4,0.0,1.0,0.0);
    glm::zero<glm::mat<4,4,float,(glm::qualifier)0>>();
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>(local_658,0.0,1.0,0.0);
    glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>(avStack_64c,0,0,0);
    glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>(avStack_640,1,1,1);
    memcpy(&this->_camera,&local_6bc,0x88);
  }
  Material::~Material((Material *)local_578);
  Shader::~Shader((Shader *)auStack_4a8);
  Material::~Material((Material *)local_428);
  Shader::~Shader((Shader *)auStack_358);
  Material::~Material((Material *)local_2d8);
  Shader::~Shader((Shader *)auStack_208);
  Material::~Material((Material *)local_188);
  Shader::~Shader((Shader *)local_58);
  return;
}

Assistant:

void Simulation::initSimulationRendering()
{
    Shader shaderProgram {};

    _fluidRenderer.mesh.dim = Config::dim;
    if (Config::dim == 3)
    {
        shaderProgram.setVert("shaders/vert.vert");
        shaderProgram.setFrag("shaders/fluid3D.frag");
    }
    else if (Config::dim == 2)
    {
        shaderProgram.setVert("shaders/vert2D.vert");
        shaderProgram.setFrag("shaders/fluid2D.frag");
    }
    Material material =
    {
        .shader = shaderProgram,
        .dim = Config::dim,
        .hasTexture = true,
        .texCoords =
        {
            1.0f, 1.0f,
            1.0f, 0.0f,
            0.0f, 0.0f,
            0.0f, 1.0f
        },
    };
    _fluidRenderer.material = material;
    _renderer.initMaterial(material);
    _renderer.initMesh(_fluidRenderer.mesh);

    Shader shaderProgramVec {};
    shaderProgramVec.setVert("shaders/vert.vert");
    shaderProgramVec.setFrag("shaders/vec.frag");
    Material materialVec =
    {
        .shader = shaderProgramVec,
        .texCoords =
        {
            1.0f, 1.0f,
            1.0f, 0.0f,
            0.0f, 0.0f,
            0.0f, 1.0f
        },
    };
    _fluidRenderer.materialVec = materialVec;
    _renderer.initMaterial(materialVec);

    Shader shaderProgramGrid {};
    shaderProgramGrid.setVert("shaders/vert.vert");
    shaderProgramGrid.setFrag("shaders/grid.frag");
    Material materialGrid =
    {
        .shader = shaderProgramGrid,
        .texCoords =
        {
            1.0f, 1.0f,
            1.0f, 0.0f,
            0.0f, 0.0f,
            0.0f, 1.0f
        },
    };
    _fluidRenderer.materialGrid = materialGrid;
    _renderer.initMaterial(materialGrid);

    Shader shaderProgramGridBorder {};
    shaderProgramGridBorder.setVert("shaders/vert.vert");
    shaderProgramGridBorder.setFrag("shaders/gridBorder.frag");
    Material materialGridBorder =
    {
        .shader = shaderProgramGridBorder,
        .texCoords =
        {
            1.0f, 1.0f,
            1.0f, 0.0f,
            0.0f, 0.0f,
            0.0f, 1.0f
        },
    };
    _fluidRenderer.materialGridBorder = materialGridBorder;
    _renderer.initMaterial(materialGridBorder);

    if (Config::dim == 3)
    {
        _camera =
        {
            .yaw = -572,
            .pitch = -31,
            .speed = 1,
            .transform = Transform
            {
                .position = {14.85, 9.39, -8.22},
                .rotation = {90, 0, 0},
                .scale = {1, 1, 1}
            },
        };
    }
    else if (Config::dim == 2)
    {
        _camera =
        {
            .yaw = -90-90-90,
            .pitch = -90,
            .speed = 1,
            .transform = Transform
            {
                .position = {0.0, 1.0, 0.0},
                .rotation = {0, 0, 0},
                .scale = {1, 1, 1}
            },
        };
    }
}